

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O3

void __thiscall TestRunner::TestRunner(TestRunner *this,char *ts_name)

{
  FILE *pFVar1;
  string filename;
  allocator<char> local_29;
  long *local_28 [2];
  long local_18 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_28,ts_name,&local_29);
  std::__cxx11::string::rfind((char *)local_28,0x1056a6,0xffffffffffffffff);
  std::__cxx11::string::erase((ulong)local_28,0);
  std::__cxx11::string::append((char *)local_28);
  pFVar1 = fopen((char *)local_28[0],"w+");
  logging_set_file(pFVar1);
  if (local_28[0] != local_18) {
    operator_delete(local_28[0],local_18[0] + 1);
  }
  return;
}

Assistant:

TestRunner( const char *ts_name )
	{
		std::string filename( ts_name );
		std::string::size_type i = filename.rfind( "/" );
		filename.erase( 0, i + 1 );
		filename += ".log";	
		//printf( "logging to file %s\n", filename.c_str() );
		FILE *log_file = fopen( filename.c_str(), "w+" );
		logging_set_file( log_file );
	}